

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall
QWidgetTextControl::setExtraSelections
          (QWidgetTextControl *this,QList<QTextEdit::ExtraSelection> *selections)

{
  const_iterator it_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  QWidgetTextControlPrivate *pQVar4;
  long lVar5;
  qsizetype qVar6;
  const_reference pEVar7;
  ulong uVar8;
  const_reference cursor;
  reference this_00;
  QList<QTextEdit::ExtraSelection> *in_RSI;
  long in_FS_OFFSET;
  int i_2;
  Selection *esel_2;
  Selection *esel_1;
  ExtraSelection *sel;
  int i_1;
  Selection *esel;
  QWidgetTextControlPrivate *d;
  QRectF r_1;
  const_iterator it_1;
  QRectF r;
  const_iterator it;
  int i;
  QMultiHash<int,_int> hash;
  Data<QHashPrivate::MultiNode<int,_int>_> *in_stack_fffffffffffffe38;
  QMultiHash<int,_int> *in_stack_fffffffffffffe40;
  Chain **in_stack_fffffffffffffe48;
  const_iterator *in_stack_fffffffffffffe50;
  QMultiHash<int,_int> *in_stack_fffffffffffffe60;
  int local_154;
  QMultiHash<int,_int> *in_stack_fffffffffffffeb0;
  const_reference in_stack_fffffffffffffeb8;
  int local_134;
  QRectF local_110;
  const_iterator local_f0;
  const_iterator local_d8;
  QRectF local_c0;
  Data<QHashPrivate::MultiNode<int,_int>_> *in_stack_ffffffffffffff70;
  const_iterator local_70;
  undefined4 local_54;
  const_iterator local_50 [2];
  undefined4 local_20;
  int local_1c;
  QMultiHash<int,_int> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QWidgetTextControl *)0x71d1ee);
  local_18.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_18.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QMultiHash<int,_int>::QMultiHash(&local_18);
  for (local_1c = 0; lVar5 = (long)local_1c,
      qVar6 = QList<QAbstractTextDocumentLayout::Selection>::size(&pQVar4->extraSelections),
      lVar5 < qVar6; local_1c = local_1c + 1) {
    QList<QAbstractTextDocumentLayout::Selection>::at
              ((QList<QAbstractTextDocumentLayout::Selection> *)in_stack_fffffffffffffe40,
               (qsizetype)in_stack_fffffffffffffe38);
    local_20 = QTextCursor::anchor();
    QMultiHash<int,_int>::insert
              ((QMultiHash<int,_int> *)in_stack_fffffffffffffe50,(int *)in_stack_fffffffffffffe48,
               (int *)in_stack_fffffffffffffe40);
  }
  local_134 = 0;
  do {
    qVar6 = QList<QTextEdit::ExtraSelection>::size(in_RSI);
    if (qVar6 <= local_134) {
      local_d8.i.d = (Data<QHashPrivate::MultiNode<int,_int>_> *)&DAT_aaaaaaaaaaaaaaaa;
      local_d8.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
      local_d8.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
      QMultiHash<int,_int>::cbegin(in_stack_fffffffffffffe60);
      while( true ) {
        QMultiHash<int,_int>::cend(in_stack_fffffffffffffe40);
        bVar1 = QMultiHash<int,_int>::const_iterator::operator!=(&local_d8,&local_f0);
        if (!bVar1) break;
        QMultiHash<int,_int>::const_iterator::value(&local_d8);
        cursor = QList<QAbstractTextDocumentLayout::Selection>::at
                           ((QList<QAbstractTextDocumentLayout::Selection> *)
                            in_stack_fffffffffffffe40,(qsizetype)in_stack_fffffffffffffe38);
        local_110.xp = -NAN;
        local_110.yp = -NAN;
        local_110.w = -NAN;
        local_110.h = -NAN;
        selectionRect((QWidgetTextControl *)in_stack_fffffffffffffeb8,&cursor->cursor);
        uVar8 = QTextFormat::boolProperty((int)cursor + 8);
        if ((uVar8 & 1) != 0) {
          QRectF::setLeft(&local_110,0.0);
          QRectF::setWidth(&local_110,2147483647.0);
        }
        updateRequest((QWidgetTextControl *)in_stack_fffffffffffffe40,
                      (QRectF *)in_stack_fffffffffffffe38);
        QMultiHash<int,_int>::const_iterator::operator++(in_stack_fffffffffffffe50);
      }
      QList<QTextEdit::ExtraSelection>::size(in_RSI);
      QList<QAbstractTextDocumentLayout::Selection>::resize
                ((QList<QAbstractTextDocumentLayout::Selection> *)in_stack_fffffffffffffe50,
                 (qsizetype)in_stack_fffffffffffffe48);
      for (local_154 = 0; qVar6 = QList<QTextEdit::ExtraSelection>::size(in_RSI), local_154 < qVar6;
          local_154 = local_154 + 1) {
        pEVar7 = QList<QTextEdit::ExtraSelection>::at
                           ((QList<QTextEdit::ExtraSelection> *)in_stack_fffffffffffffe40,
                            (qsizetype)in_stack_fffffffffffffe38);
        this_00 = QList<QAbstractTextDocumentLayout::Selection>::operator[]
                            ((QList<QAbstractTextDocumentLayout::Selection> *)
                             in_stack_fffffffffffffe40,(qsizetype)in_stack_fffffffffffffe38);
        QTextCursor::operator=(&this_00->cursor,&pEVar7->cursor);
        QList<QTextEdit::ExtraSelection>::at
                  ((QList<QTextEdit::ExtraSelection> *)in_stack_fffffffffffffe40,
                   (qsizetype)in_stack_fffffffffffffe38);
        QList<QAbstractTextDocumentLayout::Selection>::operator[]
                  ((QList<QAbstractTextDocumentLayout::Selection> *)in_stack_fffffffffffffe40,
                   (qsizetype)in_stack_fffffffffffffe38);
        QTextCharFormat::operator=
                  ((QTextCharFormat *)in_stack_fffffffffffffe40,
                   (QTextCharFormat *)in_stack_fffffffffffffe38);
      }
      QMultiHash<int,_int>::~QMultiHash(in_stack_fffffffffffffe40);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    pEVar7 = QList<QTextEdit::ExtraSelection>::at
                       ((QList<QTextEdit::ExtraSelection> *)in_stack_fffffffffffffe40,
                        (qsizetype)in_stack_fffffffffffffe38);
    local_50[0].i.d = (Data<QHashPrivate::MultiNode<int,_int>_> *)&DAT_aaaaaaaaaaaaaaaa;
    local_50[0].i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_50[0].e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
    local_54 = QTextCursor::anchor();
    QMultiHash<int,_int>::constFind(in_stack_fffffffffffffe40,(int *)in_stack_fffffffffffffe38);
    QMultiHash<int,_int>::cend(in_stack_fffffffffffffe40);
    bVar1 = QMultiHash<int,_int>::const_iterator::operator!=(local_50,&local_70);
    if (bVar1) {
      QMultiHash<int,_int>::const_iterator::value(local_50);
      in_stack_fffffffffffffeb8 =
           QList<QAbstractTextDocumentLayout::Selection>::at
                     ((QList<QAbstractTextDocumentLayout::Selection> *)in_stack_fffffffffffffe40,
                      (qsizetype)in_stack_fffffffffffffe38);
      iVar2 = QTextCursor::position();
      iVar3 = QTextCursor::position();
      if ((iVar2 != iVar3) ||
         (uVar8 = QTextFormat::operator==
                            (&(in_stack_fffffffffffffeb8->format).super_QTextFormat,
                             &(pEVar7->format).super_QTextFormat), (uVar8 & 1) == 0))
      goto LAB_0071d4dc;
      it_00.i.bucket = (size_t)local_50[0].i.d;
      it_00.i.d = in_stack_ffffffffffffff70;
      it_00.e = (Chain **)local_50[0].i.bucket;
      in_stack_fffffffffffffe38 = local_50[0].i.d;
      in_stack_fffffffffffffe40 = (QMultiHash<int,_int> *)local_50[0].i.bucket;
      in_stack_fffffffffffffe48 = local_50[0].e;
      QMultiHash<int,_int>::erase(in_stack_fffffffffffffeb0,it_00);
    }
    else {
LAB_0071d4dc:
      local_c0.xp = -NAN;
      local_c0.yp = -NAN;
      local_c0.w = -NAN;
      local_c0.h = -NAN;
      selectionRect((QWidgetTextControl *)in_stack_fffffffffffffeb8,
                    (QTextCursor *)in_stack_fffffffffffffeb0);
      uVar8 = QTextFormat::boolProperty((int)pEVar7 + 8);
      if ((uVar8 & 1) != 0) {
        QRectF::setLeft(&local_c0,0.0);
        QRectF::setWidth(&local_c0,2147483647.0);
      }
      updateRequest((QWidgetTextControl *)in_stack_fffffffffffffe40,
                    (QRectF *)in_stack_fffffffffffffe38);
    }
    local_134 = local_134 + 1;
  } while( true );
}

Assistant:

void QWidgetTextControl::setExtraSelections(const QList<QTextEdit::ExtraSelection> &selections)
{
    Q_D(QWidgetTextControl);

    QMultiHash<int, int> hash;
    for (int i = 0; i < d->extraSelections.size(); ++i) {
        const QAbstractTextDocumentLayout::Selection &esel = d->extraSelections.at(i);
        hash.insert(esel.cursor.anchor(), i);
    }

    for (int i = 0; i < selections.size(); ++i) {
        const QTextEdit::ExtraSelection &sel = selections.at(i);
        const auto it = hash.constFind(sel.cursor.anchor());
        if (it != hash.cend()) {
            const QAbstractTextDocumentLayout::Selection &esel = d->extraSelections.at(it.value());
            if (esel.cursor.position() == sel.cursor.position()
                && esel.format == sel.format) {
                hash.erase(it);
                continue;
            }
        }
        QRectF r = selectionRect(sel.cursor);
        if (sel.format.boolProperty(QTextFormat::FullWidthSelection)) {
            r.setLeft(0);
            r.setWidth(qreal(INT_MAX));
        }
        emit updateRequest(r);
    }

    for (auto it = hash.cbegin(); it != hash.cend(); ++it) {
        const QAbstractTextDocumentLayout::Selection &esel = d->extraSelections.at(it.value());
        QRectF r = selectionRect(esel.cursor);
        if (esel.format.boolProperty(QTextFormat::FullWidthSelection)) {
            r.setLeft(0);
            r.setWidth(qreal(INT_MAX));
        }
        emit updateRequest(r);
    }

    d->extraSelections.resize(selections.size());
    for (int i = 0; i < selections.size(); ++i) {
        d->extraSelections[i].cursor = selections.at(i).cursor;
        d->extraSelections[i].format = selections.at(i).format;
    }
}